

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O2

DWORD GetFileAttributesW(LPCWSTR lpFileName)

{
  DWORD DVar1;
  size_t sVar2;
  char *lpMultiByteStr;
  int *piVar3;
  int iVar4;
  long in_FS_OFFSET;
  undefined1 local_70 [8];
  PathCharString filenamePS;
  
  filenamePS.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  filenamePS._32_8_ = local_70;
  filenamePS.m_size = 0;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_00320531;
  CorUnix::InternalGetCurrentThread();
  if (lpFileName == (LPCWSTR)0x0) {
    iVar4 = 3;
LAB_003204db:
    DVar1 = 0xffffffff;
    piVar3 = __errno_location();
    *piVar3 = iVar4;
  }
  else {
    sVar2 = PAL_wcslen(lpFileName);
    iVar4 = ((int)sVar2 + 1) * MaxWCharToAcpLengthFactor;
    lpMultiByteStr =
         StackString<32UL,_char>::OpenStringBuffer((StackString<32UL,_char> *)local_70,(long)iVar4);
    if (lpMultiByteStr == (char *)0x0) {
      iVar4 = 8;
      goto LAB_003204db;
    }
    iVar4 = WideCharToMultiByte(0,0,lpFileName,-1,lpMultiByteStr,iVar4,(LPCSTR)0x0,(LPBOOL)0x0);
    if ((ulong)(long)iVar4 < filenamePS.m_size) {
      filenamePS.m_size = (long)iVar4;
    }
    *(undefined1 *)(filenamePS._32_8_ + filenamePS.m_size) = 0;
    if (iVar4 == 0) {
      DVar1 = GetLastError();
      if (DVar1 == 0x7a) {
        iVar4 = 0xce;
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_00320531;
      }
      else {
        fprintf(_stderr,"] %s %s:%d","GetFileAttributesW",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                ,0x715);
        iVar4 = 0x54f;
        fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar1);
      }
      goto LAB_003204db;
    }
    DVar1 = GetFileAttributesA(lpMultiByteStr);
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_70);
    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) != filenamePS.m_count) {
      __stack_chk_fail();
    }
    return DVar1;
  }
LAB_00320531:
  abort();
}

Assistant:

DWORD
PALAPI
GetFileAttributesW(
           IN LPCWSTR lpFileName)
{
    CPalThread *pThread;
    int   size;
    PathCharString filenamePS;
    int length = 0;
    char * filename;
    DWORD dwRet = (DWORD) -1;

    PERF_ENTRY(GetFileAttributesW);
    ENTRY("GetFileAttributesW(lpFileName=%p (%S))\n",
          lpFileName?lpFileName:W16_NULLSTRING,
          lpFileName?lpFileName:W16_NULLSTRING);

    pThread = InternalGetCurrentThread();
    if (lpFileName == NULL) 
    {
        pThread->SetLastError(ERROR_PATH_NOT_FOUND);
        goto done;
    }
    
    length = (PAL_wcslen(lpFileName)+1) * MaxWCharToAcpLengthFactor;
    filename = filenamePS.OpenStringBuffer(length);
    if (NULL == filename)
    {
        pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto done;
    }
    size = WideCharToMultiByte( CP_ACP, 0, lpFileName, -1, filename, length,
                                NULL, NULL );
    filenamePS.CloseBuffer(size);
    
    if( size == 0 )
    {
        DWORD dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            WARN("lpFileName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
            pThread->SetLastError(ERROR_FILENAME_EXCED_RANGE);
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
        }
    }
    else
        dwRet = GetFileAttributesA( filename );
done:
    LOGEXIT("GetFileAttributesW returns DWORD %#x\n", dwRet);
    PERF_EXIT(GetFileAttributesW);
    return dwRet;
}